

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O1

mpt_metatype * parseClone(mpt_metatype *mt)

{
  mpt_metatype *pmVar1;
  mpt_parseIterator *it;
  _mpt_vptr_metatype *val;
  
  val = mt[8]._vptr;
  if (val == (_mpt_vptr_metatype *)0x0) {
    val = mt[6]._vptr;
  }
  pmVar1 = mpt_iterator_string((char *)val,(char *)(mt + 10));
  return pmVar1;
}

Assistant:

static MPT_INTERFACE(metatype) *parseClone(const MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, mt, _mt);
	const char *ptr;
	
	if (it->restore) {
		ptr = it->restore;
	} else {
		ptr = it->val;
	}
	return mpt_iterator_string(ptr, (char *) (it + 1));
}